

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

bool __thiscall DnsStats::LoadPcapFiles(DnsStats *this,size_t nb_files,char **fileNames)

{
  bool bVar1;
  size_t i;
  ulong uVar2;
  
  bVar1 = true;
  for (uVar2 = 0; (bVar1 != false && (uVar2 < nb_files)); uVar2 = uVar2 + 1) {
    bVar1 = LoadPcapFile(this,fileNames[uVar2]);
  }
  return bVar1;
}

Assistant:

bool DnsStats::LoadPcapFiles(size_t nb_files, char const ** fileNames)
{
    bool ret = true;

    for (size_t i = 0; ret && i < nb_files; i++)
    {
        ret = LoadPcapFile(fileNames[i]);
    }

    return ret;
}